

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::predict_or_learn_greedy<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  float fVar1;
  action_score *paVar2;
  action_score *paVar3;
  example *peVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  data->offset = ((*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start)->super_example_predict).ft_offset;
  peVar4 = test_adf_sequence(examples);
  if (peVar4 == (example *)0x0) {
    LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  }
  else {
    LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  }
  peVar4 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  paVar2 = (peVar4->pred).a_s._begin;
  paVar3 = (action_score *)(peVar4->pred).scalars._end;
  uVar7 = (long)paVar3 - (long)paVar2 >> 3;
  if (paVar3 == paVar2) {
    uVar6 = 0;
  }
  else {
    uVar5 = 1;
    uVar6 = uVar5;
    if (1 < uVar7) {
      do {
        uVar6 = uVar5;
        if ((paVar2[uVar5].score != paVar2->score) ||
           (NAN(paVar2[uVar5].score) || NAN(paVar2->score))) break;
        uVar5 = uVar5 + 1;
        uVar6 = uVar7;
      } while (uVar7 != uVar5);
    }
  }
  if ((uVar7 & 0xffffffff) != 0) {
    fVar1 = data->epsilon;
    uVar5 = 0;
    do {
      (peVar4->pred).a_s._begin[uVar5].score = fVar1 / (float)(uVar7 & 0xffffffff);
      uVar5 = uVar5 + 1;
    } while ((uVar7 & 0xffffffff) != uVar5);
  }
  if (data->first_only == false) {
    if (uVar6 != 0) {
      uVar7 = 0;
      do {
        paVar2 = (peVar4->pred).a_s._begin;
        paVar2[uVar7].score = (1.0 - data->epsilon) / (float)uVar6 + paVar2[uVar7].score;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
  }
  else {
    paVar2 = (peVar4->pred).a_s._begin;
    paVar2->score = (1.0 - data->epsilon) + paVar2->score;
  }
  return;
}

Assistant:

void predict_or_learn_greedy(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  data.offset = examples[0]->ft_offset;
  // Explore uniform random an epsilon fraction of the time.

  if (is_learn && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);
  action_scores& preds = examples[0]->pred.a_s;

  uint32_t num_actions = (uint32_t)preds.size();

  size_t tied_actions = fill_tied(data, preds);

  const float prob = data.epsilon / num_actions;
  for (size_t i = 0; i < num_actions; i++) preds[i].score = prob;
  if (!data.first_only)
  {
    for (size_t i = 0; i < tied_actions; ++i) preds[i].score += (1.f - data.epsilon) / tied_actions;
  }
  else
    preds[0].score += 1.f - data.epsilon;
}